

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O3

ExecutionResult *
fold(ExecutionResult *__return_storage_ptr__,
    list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *l,
    longlong start,_func_longlong_longlong_longlong *llf,_func_double_double_double *df,
    bool start_with_first)

{
  _List_node_base *p_Var1;
  shared_ptr<SchemeObject> p;
  shared_ptr<SchemeObject> p_00;
  shared_ptr<SchemeObject> p_01;
  shared_ptr<SchemeObject> p_02;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ExecutionResult *extraout_RAX;
  runtime_error *this;
  long *plVar8;
  long *plVar9;
  _List_node_base *p_Var10;
  bool bVar11;
  shared_ptr<SchemeObject> p_03;
  shared_ptr<SchemeObject> p_04;
  shared_ptr<SchemeObject> p_05;
  shared_ptr<SchemeObject> p_06;
  double local_a8;
  longlong local_a0;
  char local_70 [32];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  p_Var10 = (l->
            super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  local_a0 = start;
  if (p_Var10 == (_List_node_base *)l) {
LAB_0012f51f:
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016b418;
    p_Var7 = p_Var6 + 1;
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__SchemeObject_0016b638;
    p_Var6[1]._M_use_count = (undefined4)local_a0;
    p_Var6[1]._M_weak_count = local_a0._4_4_;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
      goto LAB_0012f594;
    }
LAB_0012f56c:
    p_Var6->_M_use_count = 2;
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)p_Var7;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var6;
    iVar4 = 3;
  }
  else {
    local_a8 = (double)start;
    bVar11 = false;
    do {
      p_Var2 = p_Var10 + 1;
      p_Var1 = p_Var2->_M_next;
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10[1]._M_prev;
      p_02.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var2->_M_next;
      p_02.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2->_M_prev;
      p_01.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var2->_M_next;
      p_01.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2->_M_prev;
      p_00.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var2->_M_next;
      p_00.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2->_M_prev;
      p.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var2->_M_next;
      p.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2->_M_prev;
      if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_03.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_03.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)p_Var1;
        bVar3 = is_int(p_03);
        if (!bVar3) {
          p_04.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_04.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var1;
          bVar3 = is_float(p_04);
          goto joined_r0x0012f139;
        }
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded != '\0') goto LAB_0012f14e;
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
LAB_0012f14e:
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
        bVar3 = is_int(p);
        if (bVar3) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
          bVar3 = is_float(p_00);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
joined_r0x0012f139:
          if (!bVar3) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            (**(code **)((long)p_Var1->_M_next + 0x10))(local_70,p_Var1);
            plVar8 = (long *)std::__cxx11::string::append(local_70);
            local_50 = (long *)*plVar8;
            plVar9 = plVar8 + 2;
            if (local_50 == plVar9) {
              local_40 = *plVar9;
              lStack_38 = plVar8[3];
              local_50 = &local_40;
            }
            else {
              local_40 = *plVar9;
            }
            local_48 = plVar8[1];
            *plVar8 = (long)plVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::runtime_error::runtime_error(this,(string *)&local_50);
            *(undefined ***)this = &PTR__runtime_error_0016b300;
            __cxa_throw(this,&eval_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      if ((start_with_first & 1U) == 0) {
        p_Var6 = p_Var7;
        if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_06.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_06.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var1;
          bVar3 = is_float(p_06);
          if (!bVar3) goto LAB_0012f242;
LAB_0012f33b:
          lVar5 = __dynamic_cast(p_Var1,&SchemeObject::typeinfo,&SchemeFloat::typeinfo,0);
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (lVar5 != 0 && p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
              p_Var6 = p_Var7;
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              p_Var6 = p_Var7;
            }
          }
          local_a8 = (*df)(local_a8,*(double *)(lVar5 + 8));
          bVar11 = true;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
          bVar3 = is_float(p_02);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          if (bVar3) goto LAB_0012f33b;
LAB_0012f242:
          lVar5 = __dynamic_cast(p_Var1,&SchemeObject::typeinfo,&SchemeInt::typeinfo,0);
          if (bVar11) {
            if (lVar5 != 0 && p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              }
            }
            else {
              p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            local_a8 = (*df)(local_a8,(double)*(long *)(lVar5 + 8));
          }
          else {
            if (lVar5 != 0 && p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              }
            }
            else {
              p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            local_a0 = (*llf)(local_a0,*(longlong *)(lVar5 + 8));
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
            }
            lVar5 = __dynamic_cast(p_Var1,&SchemeObject::typeinfo,&SchemeInt::typeinfo,0);
            p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (lVar5 != 0 && p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                UNLOCK();
                p_Var6 = p_Var7;
              }
              else {
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                p_Var6 = p_Var7;
              }
            }
            local_a8 = (*df)(local_a8,(double)*(long *)(lVar5 + 8));
          }
        }
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
LAB_0012f4a9:
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0012f4ae;
      }
      else {
        if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_05.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_05.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var1;
          bVar3 = is_float(p_05);
          if (!bVar3) goto LAB_0012f1eb;
LAB_0012f2c6:
          lVar5 = __dynamic_cast(p_Var1,&SchemeObject::typeinfo,&SchemeFloat::typeinfo,0);
          if (lVar5 == 0 || p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_a8 = *(double *)(lVar5 + 8);
            bVar11 = true;
            goto LAB_0012f4a9;
          }
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
          local_a8 = *(double *)(lVar5 + 8);
          bVar11 = true;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
          bVar3 = is_float(p_01);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          if (bVar3) goto LAB_0012f2c6;
LAB_0012f1eb:
          lVar5 = __dynamic_cast(p_Var1,&SchemeObject::typeinfo,&SchemeInt::typeinfo,0);
          if (lVar5 == 0 || p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_a0 = *(long *)(lVar5 + 8);
            local_a8 = (double)local_a0;
            goto LAB_0012f4a9;
          }
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
          local_a0 = *(long *)(lVar5 + 8);
          local_a8 = (double)local_a0;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
LAB_0012f4ae:
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      p_Var10 = (((_List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                   *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      start_with_first = false;
    } while (p_Var10 != (_List_node_base *)l);
    if (!bVar11) goto LAB_0012f51f;
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016b468;
    p_Var7 = p_Var6 + 1;
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__SchemeObject_0016b698;
    *(double *)&p_Var6[1]._M_use_count = local_a8;
    if (__libc_single_threaded != '\0') goto LAB_0012f56c;
    LOCK();
    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    UNLOCK();
LAB_0012f594:
    bVar11 = __libc_single_threaded == '\0';
    __return_storage_ptr__->type = VALUE;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)p_Var7;
    (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var6;
    if (bVar11) {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
      goto LAB_0012f5b1;
    }
    iVar4 = p_Var6->_M_use_count + 1;
  }
  p_Var6->_M_use_count = iVar4;
LAB_0012f5b1:
  (__return_storage_ptr__->tail_context)._M_t.
  super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
  super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
  super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  return extraout_RAX;
}

Assistant:

static ExecutionResult fold(const std::list<std::shared_ptr<SchemeObject>> &l, long long start,
                            long long (*llf)(long long, long long), double (*df)(double, double),
                            bool start_with_first = false)
{
    long long n = start;
    double d = start;
    bool is_double = false;
    for(auto i : l)
    {
        if(!is_int(i) && !is_float(i))
        {
            throw eval_error(i->external_repr() + " is not an number");
        }
        if(start_with_first)
        {
            if(is_float(i))
            {
                is_double = true;
                d = std::dynamic_pointer_cast<SchemeFloat>(i)->value;
            }
            else
            {
                d = n = std::dynamic_pointer_cast<SchemeInt>(i)->value;
            }
            start_with_first = false;
            continue;
        }
        if(is_float(i))
        {
            is_double = true;
            d = df(d, std::dynamic_pointer_cast<SchemeFloat>(i)->value);
        }
        else if(is_double)
        {
            d = df(d, std::dynamic_pointer_cast<SchemeInt>(i)->value);
        }
        else
        {
            n = llf(n, std::dynamic_pointer_cast<SchemeInt>(i)->value);
            d = df(d, std::dynamic_pointer_cast<SchemeInt>(i)->value);
        }
    }
    if(is_double)
        return to_object(std::make_shared<SchemeFloat>(d));
    else
        return to_object(std::make_shared<SchemeInt>(n));
}